

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::Subcase::Subcase(Subcase *this,String *name,char *file,int line)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *this_00;
  reference ppIVar4;
  undefined4 in_ECX;
  pointer in_RDX;
  vector<doctest::String,_std::allocator<doctest::String>_> *in_RDI;
  IReporter **curr_rep;
  iterator __end2;
  iterator __begin2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2;
  ContextState *s;
  String *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  value_type *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined2 uVar5;
  char *in_stack_ffffffffffffffa8;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_48;
  long local_40;
  long local_28;
  undefined4 local_1c;
  pointer local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  String::String((String *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
  in_RDI[1].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
  super__Vector_impl_data._M_start = local_18;
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
    super__Vector_impl_data._M_finish = local_1c;
  *(undefined1 *)
   &in_RDI[1].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  local_28 = g_cs;
  sVar2 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::size
                    ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                      *)(g_cs + 0x1110));
  if (sVar2 < (ulong)(long)*(int *)(local_28 + 0x68)) {
    pcVar3 = String::c_str(in_stack_ffffffffffffff78);
    uVar5 = (undefined2)((ulong)pcVar3 >> 0x30);
    std::
    vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
    ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                  *)(local_28 + 0x10b8),6);
    in_stack_ffffffffffffff97 =
         anon_unknown_14::matchesAny
                   (in_stack_ffffffffffffffa8,in_RDI,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
    if (!(bool)in_stack_ffffffffffffff97) {
      return;
    }
    in_stack_ffffffffffffff88 = (value_type *)String::c_str(in_stack_ffffffffffffff78);
    std::
    vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
    ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                  *)(local_28 + 0x10b8),7);
    in_stack_ffffffffffffff87 =
         anon_unknown_14::matchesAny
                   (in_stack_ffffffffffffffa8,in_RDI,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
    if ((bool)in_stack_ffffffffffffff87) {
      return;
    }
  }
  sVar2 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::size
                    ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                      *)(local_28 + 0x1110));
  if (sVar2 < (ulong)(long)*(int *)(local_28 + 0x1158)) {
    *(undefined1 *)(local_28 + 0x115c) = 1;
  }
  else {
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::push_back
              ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    this_00 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
              std::
              set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
              ::count((set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                      (key_type *)in_stack_ffffffffffffff88);
    if (this_00 == (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)0x0) {
      sVar2 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              size((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
                   (local_28 + 0x1110));
      *(int *)(local_28 + 0x1158) = (int)sVar2;
      *(undefined1 *)
       &in_RDI[1].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 1;
      local_40 = g_cs + 0x10d0;
      local_48._M_current =
           (IReporter **)
           std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin(this_00);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                                (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)this_00), bVar1) {
        ppIVar4 = __gnu_cxx::
                  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                  ::operator*(&local_48);
        (*(*ppIVar4)->_vptr_IReporter[7])(*ppIVar4,in_RDI);
        __gnu_cxx::
        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
        ::operator++(&local_48);
      }
    }
    else {
      std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::pop_back
                ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
                 0x10b613);
    }
  }
  return;
}

Assistant:

Subcase::Subcase(const String& name, const char* file, int line)
            : m_signature({name, file, line}) {
        auto* s = g_cs;

        // check subcase filters
        if(s->subcasesStack.size() < size_t(s->subcase_filter_levels)) {
            if(!matchesAny(m_signature.m_name.c_str(), s->filters[6], true, s->case_sensitive))
                return;
            if(matchesAny(m_signature.m_name.c_str(), s->filters[7], false, s->case_sensitive))
                return;
        }
        
        // if a Subcase on the same level has already been entered
        if(s->subcasesStack.size() < size_t(s->subcasesCurrentMaxLevel)) {
            s->should_reenter = true;
            return;
        }

        // push the current signature to the stack so we can check if the
        // current stack + the current new subcase have been traversed
        s->subcasesStack.push_back(m_signature);
        if(s->subcasesPassed.count(s->subcasesStack) != 0) {
            // pop - revert to previous stack since we've already passed this
            s->subcasesStack.pop_back();
            return;
        }

        s->subcasesCurrentMaxLevel = s->subcasesStack.size();
        m_entered = true;

        DOCTEST_ITERATE_THROUGH_REPORTERS(subcase_start, m_signature);
    }